

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O0

void aes_psp_decrypt_x86(aes_context *ctx,uint8_t *prev,uint8_t *block,uint8_t *buffer,uint32_t size
                        )

{
  longlong lVar1;
  ulong *puVar2;
  __m128i *key_00;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qb;
  __m128i alVar3;
  __m128i out;
  ulong *puStack_140;
  uint32_t i;
  __m128i *data;
  __m128i y;
  __m128i x;
  __m128i one;
  __m128i *key;
  uint32_t size_local;
  uint8_t *buffer_local;
  uint8_t *block_local;
  uint8_t *prev_local;
  aes_context *ctx_local;
  undefined4 uStack_30;
  int iStack_2c;
  
  key_00 = (__m128i *)0x0;
  puVar2 = (ulong *)0x0;
  x[0] = *(longlong *)(prev + 8);
  lVar1 = *(longlong *)block;
  y[0] = *(longlong *)(block + 8);
  puStack_140 = (ulong *)buffer;
  y[1] = *(longlong *)prev;
  for (out[1]._4_4_ = 0; out[1]._4_4_ < size; out[1]._4_4_ = out[1]._4_4_ + 0x10) {
    uStack_30 = (undefined4)y[0];
    iStack_2c = (int)((ulong)y[0] >> 0x20);
    y[0] = CONCAT44(iStack_2c + 1,uStack_30);
    alVar3[1]._0_4_ = ctx->nr;
    alVar3[0] = (longlong)ctx->key;
    alVar3[1]._4_4_ = 0;
    alVar3 = aes_decrypt_x86(alVar3,key_00,(int)puVar2);
    key_00 = alVar3[1];
    puVar2 = puStack_140 + 2;
    *puStack_140 = extraout_XMM0_Qa ^ *puStack_140 ^ y[1];
    puStack_140[1] = extraout_XMM0_Qb ^ puStack_140[1] ^ x[0];
    x[0] = y[0];
    puStack_140 = puVar2;
    y[1] = lVar1;
  }
  return;
}

Assistant:

void aes_psp_decrypt_x86(const aes_context* ctx, const uint8_t* prev, const uint8_t* block, uint8_t* buffer, uint32_t size)
{
  const __m128i* key = (__m128i*)ctx->key;
  __m128i one = _mm_setr_epi32(0, 0, 0, 1);

  __m128i x = _mm_load_si128((__m128i*)prev);
  __m128i y = _mm_load_si128((__m128i*)block);

  __m128i* data = (__m128i*)buffer;

  for (uint32_t i = 0; i < size; i += 16)
  {
    y = _mm_add_epi32(y, one);

    __m128i out = aes_decrypt_x86(y, key, ctx->nr);

    out = _mm_xor_si128(out, _mm_loadu_si128(data));
    out = _mm_xor_si128(out, x);
    _mm_storeu_si128(data++, out);
    x = y;
  }
}